

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O1

void gen_sub_CC(DisasContext_conflict14 *ctx,TCGv_i32 ret,TCGv_i32 r1,TCGv_i32 r2)

{
  TCGContext_conflict9 *s;
  TCGTemp *a2;
  TCGTemp *ts;
  uintptr_t o_1;
  uintptr_t o;
  uintptr_t o_3;
  TCGv_i32 ret_00;
  
  s = ctx->uc->tcg_ctx;
  a2 = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
  ret_00 = (TCGv_i32)((long)a2 - (long)s);
  ts = tcg_temp_new_internal_tricore(s,TCG_TYPE_I32,false);
  tcg_gen_sub_i32(s,ret_00,r1,r2);
  tcg_gen_setcond_i32_tricore(s,TCG_COND_GEU,s->cpu_PSW_C,r1,r2);
  tcg_gen_op3_tricore(s,INDEX_op_xor_i32,(TCGArg)(s->cpu_PSW_V + (long)s),(TCGArg)a2,
                      (TCGArg)(r1 + (long)s));
  tcg_gen_op3_tricore(s,INDEX_op_xor_i32,(TCGArg)ts,(TCGArg)(r1 + (long)s),(TCGArg)(r2 + (long)s));
  tcg_gen_op3_tricore(s,INDEX_op_and_i32,(TCGArg)(s->cpu_PSW_V + (long)s),
                      (TCGArg)(s->cpu_PSW_V + (long)s),(TCGArg)ts);
  tcg_gen_op3_tricore(s,INDEX_op_or_i32,(TCGArg)(s->cpu_PSW_SV + (long)s),
                      (TCGArg)(s->cpu_PSW_SV + (long)s),(TCGArg)(s->cpu_PSW_V + (long)s));
  tcg_gen_op3_tricore(s,INDEX_op_add_i32,(TCGArg)(s->cpu_PSW_AV + (long)s),(TCGArg)a2,(TCGArg)a2);
  tcg_gen_op3_tricore(s,INDEX_op_xor_i32,(TCGArg)(s->cpu_PSW_AV + (long)s),(TCGArg)a2,
                      (TCGArg)(s->cpu_PSW_AV + (long)s));
  tcg_gen_op3_tricore(s,INDEX_op_or_i32,(TCGArg)(s->cpu_PSW_SAV + (long)s),
                      (TCGArg)(s->cpu_PSW_SAV + (long)s),(TCGArg)(s->cpu_PSW_AV + (long)s));
  if (ret_00 != ret) {
    tcg_gen_op2_tricore(s,INDEX_op_mov_i32,(TCGArg)(ret + (long)s),(TCGArg)a2);
  }
  tcg_temp_free_internal_tricore(s,(TCGTemp *)(ret_00 + (long)s));
  tcg_temp_free_internal_tricore(s,ts);
  return;
}

Assistant:

static void gen_sub_CC(TCGContext *tcg_ctx, TCGv_i32 dest, TCGv_i32 t0, TCGv_i32 t1)
{
    TCGv_i32 tmp;
    tcg_gen_sub_i32(tcg_ctx, tcg_ctx->cpu_NF, t0, t1);
    tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_ZF, tcg_ctx->cpu_NF);
    tcg_gen_setcond_i32(tcg_ctx, TCG_COND_GEU, tcg_ctx->cpu_CF, t0, t1);
    tcg_gen_xor_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_NF, t0);
    tmp = tcg_temp_new_i32(tcg_ctx);
    tcg_gen_xor_i32(tcg_ctx, tmp, t0, t1);
    tcg_gen_and_i32(tcg_ctx, tcg_ctx->cpu_VF, tcg_ctx->cpu_VF, tmp);
    tcg_temp_free_i32(tcg_ctx, tmp);
    tcg_gen_mov_i32(tcg_ctx, dest, tcg_ctx->cpu_NF);
}